

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-test.c++
# Opt level: O0

void __thiscall capnp::compiler::anon_unknown_0::TestCase361::run(TestCase361 *this)

{
  int iVar1;
  char *__s2;
  ArrayPtr<const_char> local_78;
  String local_68;
  char *local_50;
  bool local_45;
  bool _kj_shouldLog;
  ArrayPtr<const_char> local_38;
  String local_28;
  TestCase361 *local_10;
  TestCase361 *this_local;
  
  local_10 = this;
  kj::StringPtr::StringPtr((StringPtr *)&local_38,anon_var_dwarf_1f27b1);
  doLex<capnp::compiler::LexedTokens>(&local_28,(StringPtr)local_38);
  __s2 = kj::String::cStr(&local_28);
  iVar1 = strcmp("(tokens = [(identifier = \'foo\', startByte = 3, endByte = 6), (identifier = \'bar\', startByte = 7, endByte = 10), (identifier = \'baz\', startByte = 13, endByte = 16)])"
                 ,__s2);
  kj::String::~String(&local_28);
  if (iVar1 != 0) {
    local_45 = kj::_::Debug::shouldLog(ERROR);
    while (local_45 != false) {
      kj::StringPtr::StringPtr((StringPtr *)&local_78,anon_var_dwarf_1f27b1);
      doLex<capnp::compiler::LexedTokens>(&local_68,(StringPtr)local_78);
      local_50 = kj::String::cStr(&local_68);
      kj::_::Debug::log<char_const(&)[280],char_const(&)[165],char_const*>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/lexer-test.c++"
                 ,0x170,ERROR,
                 "\"failed: expected \" \"::strcmp(\\\"(tokens = [\\\" \\\"(identifier = \'foo\', startByte = 3, endByte = 6), \\\" \\\"(identifier = \'bar\', startByte = 7, endByte = 10), \\\" \\\"(identifier = \'baz\', startByte = 13, endByte = 16)\\\" \\\"])\\\", doLex<LexedTokens>(\\\"\\\\xef\\\\xbb\\\\xbf\\\"\\\"foo bar\\\\xef\\\\xbb\\\\xbf\\\"\\\"baz\\\").cStr()) == 0\", \"(tokens = [\" \"(identifier = \'foo\', startByte = 3, endByte = 6), \" \"(identifier = \'bar\', startByte = 7, endByte = 10), \" \"(identifier = \'baz\', startByte = 13, endByte = 16)\" \"])\", doLex<LexedTokens>(\"\\xef\\xbb\\xbf\"\"foo bar\\xef\\xbb\\xbf\"\"baz\").cStr()"
                 ,(char (*) [280])
                  "failed: expected ::strcmp(\"(tokens = [\" \"(identifier = \'foo\', startByte = 3, endByte = 6), \" \"(identifier = \'bar\', startByte = 7, endByte = 10), \" \"(identifier = \'baz\', startByte = 13, endByte = 16)\" \"])\", doLex<LexedTokens>(\"\\xef\\xbb\\xbf\"\"foo bar\\xef\\xbb\\xbf\"\"baz\").cStr()) == 0"
                 ,(char (*) [165])
                  "(tokens = [(identifier = \'foo\', startByte = 3, endByte = 6), (identifier = \'bar\', startByte = 7, endByte = 10), (identifier = \'baz\', startByte = 13, endByte = 16)])"
                 ,&local_50);
      kj::String::~String(&local_68);
      local_45 = false;
    }
  }
  return;
}

Assistant:

TEST(Lexer, Utf8Bom) {
  EXPECT_STREQ(
      "(tokens = ["
        "(identifier = 'foo', startByte = 3, endByte = 6), "
        "(identifier = 'bar', startByte = 7, endByte = 10), "
        "(identifier = 'baz', startByte = 13, endByte = 16)"
      "])",
      doLex<LexedTokens>("\xef\xbb\xbf""foo bar\xef\xbb\xbf""baz").cStr());
}